

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

ssize_t __thiscall serial::Serial::read(Serial *this,int __fd,void *__buf,size_t __nbytes)

{
  void *__nbytes_00;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  exception *e;
  size_t bytes_read;
  uint8_t *buffer_;
  ScopedReadLock lock;
  size_t size_local;
  string *buffer_local;
  Serial *this_local;
  
  lock.pimpl_ = (SerialImpl *)__buf;
  ScopedReadLock::ScopedReadLock((ScopedReadLock *)&buffer_,this->pimpl_);
  __nbytes_00 = operator_new__((ulong)lock.pimpl_);
  sVar1 = SerialImpl::read(this->pimpl_,(int)__nbytes_00,lock.pimpl_,(size_t)__nbytes_00);
  std::__cxx11::string::append((char *)CONCAT44(in_register_00000034,__fd),(ulong)__nbytes_00);
  if (__nbytes_00 != (void *)0x0) {
    operator_delete__(__nbytes_00);
  }
  ScopedReadLock::~ScopedReadLock((ScopedReadLock *)&buffer_);
  return sVar1;
}

Assistant:

size_t
Serial::read (std::string &buffer, size_t size)
{
  ScopedReadLock lock(this->pimpl_);
  uint8_t *buffer_ = new uint8_t[size];
  size_t bytes_read = 0;
  try {
    bytes_read = this->pimpl_->read (buffer_, size);
  }
  catch (const std::exception &e) {
    delete[] buffer_;
    throw;
  }
  buffer.append (reinterpret_cast<const char*>(buffer_), bytes_read);
  delete[] buffer_;
  return bytes_read;
}